

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

size_t __thiscall rcg::Buffer::getWidth(Buffer *this,uint32_t part)

{
  bool bVar1;
  undefined8 *in_RDI;
  exception *anon_var_0;
  bool in_stack_000001d6;
  bool in_stack_000001d7;
  int64_t *in_stack_000001d8;
  int64_t *in_stack_000001e0;
  char *in_stack_000001e8;
  shared_ptr<GenApi_3_4::CNodeMapRef> *in_stack_000001f0;
  undefined8 in_stack_ffffffffffffffb8;
  BUFFER_INFO_CMD cmd;
  void *in_stack_ffffffffffffffc0;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_ffffffffffffffe0;
  unsigned_long local_8;
  
  cmd = (BUFFER_INFO_CMD)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  if ((*(byte *)(in_RDI + 5) & 1) == 0) {
    if ((in_RDI[4] == 4) &&
       (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 6)), bVar1)) {
      local_8 = getInteger(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,in_stack_000001d8,
                           in_stack_000001d7,in_stack_000001d6);
    }
    else {
      Stream::getHandle((Stream *)*in_RDI);
      local_8 = anon_unknown_5::getBufferValue<unsigned_long>
                          (in_stack_ffffffffffffffd0,in_RDI,in_stack_ffffffffffffffc0,cmd);
    }
  }
  else {
    Stream::getHandle((Stream *)*in_RDI);
    local_8 = anon_unknown_5::getBufferPartValue<unsigned_long>
                        (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                         in_stack_ffffffffffffffd0,(uint32_t)((ulong)in_RDI >> 0x20),
                         (BUFFER_PART_INFO_CMD)in_RDI);
  }
  return local_8;
}

Assistant:

size_t Buffer::getWidth(uint32_t part) const
{
  if (multipart)
  {
    return getBufferPartValue<size_t>(gentl, parent->getHandle(), buffer, part,
                                      GenTL::BUFFER_PART_INFO_WIDTH);
  }
  else
  {
    if (payload_type == PAYLOAD_TYPE_CHUNK_DATA && nodemap)
    {
      try
      {
        return getInteger(nodemap, "ChunkWidth", 0, 0, true);
      }
      catch (const std::exception &)
      {
        // ignore error and try getBufferValue()
      }
    }

    return getBufferValue<size_t>(gentl, parent->getHandle(), buffer, GenTL::BUFFER_INFO_WIDTH);
  }
}